

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickhull.hpp
# Opt level: O3

void __thiscall
quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>,double>::
make_facet<std::_List_const_iterator<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>>>
          (quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>,double>
           *this,facet *_facet,
          _List_const_iterator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>
          sbeg,size_type _vertex,bool _swap)

{
  pointer *pp_Var1;
  iterator __position;
  iterator __position_00;
  pointer p_Var2;
  pointer p_Var3;
  _Fwd_list_node_base *p_Var4;
  pointer puVar5;
  pointer puVar6;
  unsigned_long uVar7;
  ulong __new_size;
  undefined3 in_register_00000081;
  unsigned_long local_40;
  undefined4 local_34;
  
  local_34 = CONCAT31(in_register_00000081,_swap);
  std::
  vector<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
  ::reserve(&_facet->vertices_,*(size_type *)this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&_facet->neighbours_,*(size_type *)this);
  local_40 = 0;
  do {
    uVar7 = _vertex;
    if (local_40 != _vertex) {
      __position._M_current =
           (_facet->vertices_).
           super__Vector_base<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (_facet->vertices_).
          super__Vector_base<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>,std::allocator<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>>>
        ::
        _M_realloc_insert<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>const&>
                  ((vector<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>,std::allocator<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>>>
                    *)_facet,__position,
                   (_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_> *)
                   (sbeg._M_node + 1));
      }
      else {
        (__position._M_current)->_M_node = (_Fwd_list_node_base *)sbeg._M_node[1]._M_next;
        pp_Var1 = &(_facet->vertices_).
                   super__Vector_base<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pp_Var1 = *pp_Var1 + 1;
      }
      __position_00._M_current =
           (_facet->neighbours_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (_facet->neighbours_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&_facet->neighbours_,
                   __position_00,&local_40);
        uVar7 = local_40;
      }
      else {
        *__position_00._M_current = local_40;
        (_facet->neighbours_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position_00._M_current + 1;
        uVar7 = local_40;
      }
    }
    sbeg._M_node = (sbeg._M_node)->_M_next;
    local_40 = uVar7 + 1;
    __new_size = *(ulong *)this;
  } while (local_40 <= __new_size);
  if (((char)__new_size - (char)_vertex & 1U) != (byte)local_34) {
    p_Var2 = (_facet->vertices_).
             super__Vector_base<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    p_Var3 = (_facet->vertices_).
             super__Vector_base<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    p_Var4 = p_Var2->_M_node;
    p_Var2->_M_node = p_Var3[-1]._M_node;
    p_Var3[-1]._M_node = p_Var4;
    puVar5 = (_facet->neighbours_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar6 = (_facet->neighbours_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar7 = *puVar5;
    *puVar5 = puVar6[-1];
    puVar6[-1] = uVar7;
    __new_size = *(ulong *)this;
  }
  std::vector<double,_std::allocator<double>_>::resize(&_facet->normal_,__new_size);
  return;
}

Assistant:

void
    make_facet(facet & _facet,
               iterator sbeg, // simplex
               size_type const _vertex,
               bool const _swap)
    {
        using iterator_traits = std::iterator_traits< iterator >;
        static_assert(std::is_base_of< std::input_iterator_tag, typename iterator_traits::iterator_category >::value);
        static_assert(std::is_constructible< point_iterator, typename iterator_traits::value_type >::value);
        _facet.vertices_.reserve(dimension_);
        _facet.neighbours_.reserve(dimension_);
        for (size_type v = 0; v <= dimension_; ++v) {
            if (v != _vertex) {
                _facet.vertices_.push_back(*sbeg);
                _facet.neighbours_.push_back(v);
            }
            ++sbeg;
        }
        if (_swap == (((dimension_ - _vertex) % 2) == 0)) {
            using std::swap;
            swap(_facet.vertices_.front(), _facet.vertices_.back());
            swap(_facet.neighbours_.front(), _facet.neighbours_.back());
        }
        _facet.normal_.resize(dimension_);
    }